

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::NewScObject_Helper
          (InterpreterStackFrame *this,Var target,ArgSlot ArgCount,
          AuxArray<unsigned_int> *spreadIndices)

{
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  InterpreterStackFrame *pIVar2;
  code *pcVar3;
  bool bVar4;
  RegSlot RVar5;
  RegSlot RVar6;
  Var obj;
  undefined4 *puVar7;
  RecyclableObject *value;
  undefined8 *puVar8;
  undefined6 in_register_00000012;
  Arguments local_40;
  
  local_40.Info = (Type)(CONCAT62(in_register_00000012,ArgCount) & 0xffffffff | 0x1000000);
  local_40.Values = *(Type *)(this + 0x28);
  scriptContext = *(ScriptContext **)(this + 0x78);
  pTVar1 = scriptContext->threadContext;
  bVar4 = pTVar1->reentrancySafeOrHandled;
  pTVar1->reentrancySafeOrHandled = true;
  obj = JavascriptOperators::NewScObject(target,&local_40,scriptContext,spreadIndices);
  pTVar1->reentrancySafeOrHandled = bVar4;
  if ((ArgSlot)(ArgCount + 1) == 0) {
    ::Math::DefaultOverflowPolicy();
  }
  puVar8 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)(ushort)(ArgCount + 1) * -8);
  *(undefined8 **)(this + 0x30) = puVar8;
  *(undefined8 *)(this + 0x28) = *puVar8;
  RVar5 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar2 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar5 * 8 + 0x160 <= pIVar2) {
    RVar5 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar6 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar2 < this + (ulong)RVar6 * 8 + (ulong)RVar5 * 8 + 0x160) goto LAB_00a4882e;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar7 = 0;
LAB_00a4882e:
  bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar4) {
    value = JavascriptProxy::AutoProxyWrapper(obj);
    obj = CrossSite::MarshalVar(*(ScriptContext **)(this + 0x78),value,false);
  }
  return obj;
}

Assistant:

Var InterpreterStackFrame::NewScObject_Helper(Var target, ArgSlot ArgCount, const Js::AuxArray<uint32> *spreadIndices)
    {
        Arguments args(CallInfo(CallFlags_New, ArgCount), m_outParams);

        Var newVarInstance = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
        {
            newVarInstance = JavascriptOperators::NewScObject(target, args, GetScriptContext(), spreadIndices);
        }
        END_SAFE_REENTRANT_CALL

            PopOut(ArgCount);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newVarInstance));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newVarInstance = JavascriptProxy::AutoProxyWrapper(newVarInstance);
            // this might come from a different scriptcontext.
            newVarInstance = CrossSite::MarshalVar(GetScriptContext(), newVarInstance);
        }
#endif
#ifdef ENABLE_BASIC_TELEMETRY
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().NewScriptObject(target, args, newVarInstance);
        }
#endif
        return newVarInstance;
    }